

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  uint uVar1;
  int local_b4;
  char local_a8 [8];
  char buf [50];
  int charrefLen;
  int cur;
  xmlChar *utf;
  uchar local_58 [4];
  int len;
  xmlChar charref [20];
  uint local_38;
  int local_34;
  int toconv;
  int writtentot;
  int written;
  int ret;
  xmlBufferPtr in_local;
  xmlBufferPtr out_local;
  xmlCharEncodingHandler *handler_local;
  
  local_34 = 0;
  if ((handler == (xmlCharEncodingHandler *)0x0) ||
     (_written = in, in_local = out, out_local = (xmlBufferPtr)handler, out == (xmlBufferPtr)0x0)) {
    return -1;
  }
LAB_0014fd86:
  toconv = in_local->size - in_local->use;
  if (0 < toconv) {
    toconv = toconv + -1;
  }
  if (_written == (xmlBufferPtr)0x0) {
    local_38 = 0;
    xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,in_local->content + in_local->use,&toconv,
                      (uchar *)0x0,(int *)&local_38);
    in_local->use = toconv + in_local->use;
    in_local->content[in_local->use] = '\0';
    return 0;
  }
  local_38 = _written->use;
  if (local_38 == 0) {
    return 0;
  }
  if (toconv <= (int)(local_38 * 4)) {
    xmlBufferGrow(in_local,local_38 << 2);
    toconv = (in_local->size - in_local->use) + -1;
  }
  writtentot = xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,
                                 in_local->content + in_local->use,&toconv,_written->content,
                                 (int *)&local_38);
  xmlBufferShrink(_written,local_38);
  in_local->use = toconv + in_local->use;
  local_34 = toconv + local_34;
  in_local->content[in_local->use] = '\0';
  if (writtentot == -1) goto code_r0x0014feb5;
  goto LAB_0014fec7;
code_r0x0014feb5:
  if (toconv < 1) {
    writtentot = -3;
LAB_0014fec7:
    switch(writtentot) {
    case 0:
      goto switchD_0014fef4_default;
    case -4:
      xmlEncodingErr(XML_I18N_NO_OUTPUT,"xmlCharEncOutFunc: no output function !\n",(char *)0x0);
      writtentot = -1;
      goto switchD_0014fef4_default;
    case -3:
      goto switchD_0014fef4_default;
    case -2:
      goto switchD_0014fef4_caseD_fffffffe;
    case -1:
    default:
      goto switchD_0014fef4_default;
    }
  }
  goto LAB_0014fd86;
switchD_0014fef4_caseD_fffffffe:
  utf._4_4_ = _written->use;
  uVar1 = xmlGetUTF8Char(_written->content,(int *)((long)&utf + 4));
  if ((int)uVar1 < 1) goto switchD_0014fef4_default;
  register0x00000000 = snprintf((char *)local_58,0x14,"&#%d;",(ulong)uVar1);
  xmlBufferShrink(_written,utf._4_4_);
  xmlBufferGrow(in_local,stack0xffffffffffffff90 << 2);
  toconv = (in_local->size - in_local->use) + -1;
  local_38 = stack0xffffffffffffff90;
  writtentot = xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,
                                 in_local->content + in_local->use,&toconv,local_58,(int *)&local_38
                                );
  if ((writtentot < 0) || (local_38 != stack0xffffffffffffff90)) {
    snprintf(local_a8,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*_written->content,
             (ulong)_written->content[1],(ulong)_written->content[2],(uint)_written->content[3]);
    buf[0x29] = '\0';
    xmlEncodingErr(XML_I18N_CONV_FAILED,"output conversion failed due to conv error, bytes %s\n",
                   local_a8);
    if (_written->alloc != XML_BUFFER_ALLOC_IMMUTABLE) {
      *_written->content = ' ';
    }
switchD_0014fef4_default:
    if (local_34 == 0) {
      local_b4 = writtentot;
    }
    else {
      local_b4 = local_34;
    }
    return local_b4;
  }
  in_local->use = toconv + in_local->use;
  local_34 = toconv + local_34;
  in_local->content[in_local->use] = '\0';
  goto LAB_0014fd86;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
#ifdef DEBUG_ENCODING
	xmlGenericError(xmlGenericErrorContext,
		"initialized encoder\n");
#endif
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv == 0)
	return(0);
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;
    if (ret == -1) {
        if (written > 0) {
            /* Can be a limitation of iconv or uconv */
            goto retry;
        }
        ret = -3;
    }

    /*
     * Attempt to handle error cases
     */
    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of output\n",
	            toconv, written);
#endif
	    break;
        case -1:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,
		    "output conversion failed by lack of space\n");
#endif
	    break;
        case -3:
#ifdef DEBUG_ENCODING
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of output %d left\n",
	            toconv, written, in->use);
#endif
	    break;
        case -4:
	    xmlEncodingErr(XML_I18N_NO_OUTPUT,
		           "xmlCharEncOutFunc: no output function !\n", NULL);
	    ret = -1;
            break;
        case -2: {
	    xmlChar charref[20];
	    int len = in->use;
	    const xmlChar *utf = (const xmlChar *) in->content;
	    int cur, charrefLen;

	    cur = xmlGetUTF8Char(utf, &len);
	    if (cur <= 0)
                break;

#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                    "handling output conversion error\n");
            xmlGenericError(xmlGenericErrorContext,
                    "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
                    in->content[0], in->content[1],
                    in->content[2], in->content[3]);
#endif
            /*
             * Removes the UTF8 sequence, and replace it by a charref
             * and continue the transcoding phase, hoping the error
             * did not mangle the encoder state.
             */
            charrefLen = snprintf((char *) &charref[0], sizeof(charref),
                             "&#%d;", cur);
            xmlBufferShrink(in, len);
            xmlBufferGrow(out, charrefLen * 4);
	    written = out->size - out->use - 1;
            toconv = charrefLen;
            ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                    charref, &toconv);

	    if ((ret < 0) || (toconv != charrefLen)) {
		char buf[50];

		snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
			 in->content[0], in->content[1],
			 in->content[2], in->content[3]);
		buf[49] = 0;
		xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "output conversion failed due to conv error, bytes %s\n",
			       buf);
		if (in->alloc != XML_BUFFER_ALLOC_IMMUTABLE)
		    in->content[0] = ' ';
	        break;
	    }

            out->use += written;
            writtentot += written;
            out->content[out->use] = 0;
            goto retry;
	}
    }
    return(writtentot ? writtentot : ret);
}